

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O0

int lgx_type_cmp(lgx_type_t *t1,lgx_type_t *t2)

{
  int iVar1;
  lgx_type_t *t2_local;
  lgx_type_t *t1_local;
  
  if (t1->type != t2->type) {
    return 1;
  }
  switch(t1->type) {
  case T_UNKNOWN:
    t1_local._4_4_ = 1;
    break;
  default:
    goto LAB_0015a6fd;
  case T_ARRAY:
    t1_local._4_4_ = lgx_type_cmp(&((t1->u).arr)->value,&((t2->u).arr)->value);
    break;
  case T_MAP:
    iVar1 = lgx_type_cmp(&((t1->u).arr)->value,&((t2->u).arr)->value);
    if (iVar1 == 0) {
      t1_local._4_4_ = lgx_type_cmp(&((t1->u).map)->value,&((t2->u).map)->value);
    }
    else {
      t1_local._4_4_ = 1;
    }
    break;
  case T_STRUCT:
    goto LAB_0015a6fd;
  case T_INTERFACE:
LAB_0015a6fd:
    t1_local._4_4_ = 0;
    break;
  case T_FUNCTION:
    t1_local._4_4_ =
         lgx_type_cmp_function
                   ((lgx_type_function_t *)(t1->u).arr,(lgx_type_function_t *)(t2->u).arr);
  }
  return t1_local._4_4_;
}

Assistant:

int lgx_type_cmp(lgx_type_t* t1, lgx_type_t* t2) {
    if (t1->type != t2->type) {
        return 1;
    }

    switch (t1->type) {
        case T_UNKNOWN:
            // unknown != unknown
            return 1;
        case T_ARRAY:
            return lgx_type_cmp(&t1->u.arr->value, &t2->u.arr->value);
        case T_MAP:
            if (lgx_type_cmp(&t1->u.map->key, &t2->u.map->key)) {
                return 1;
            }
            return lgx_type_cmp(&t1->u.map->value, &t2->u.map->value);
        case T_STRUCT:
            // TODO
            break;
        case T_INTERFACE:
            // TODO
            break;
        case T_FUNCTION:
            return lgx_type_cmp_function(t1->u.fun, t2->u.fun);
        default:
            break;
    }

    return 0;
}